

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS
ref_mpi_alltoallv_native
          (REF_MPI ref_mpi,void *send,REF_INT *send_size,void *recv,REF_INT *recv_size,REF_INT n,
          REF_TYPE type)

{
  REF_INT n_local;
  REF_INT *recv_size_local;
  void *recv_local;
  REF_INT *send_size_local;
  void *send_local;
  REF_MPI ref_mpi_local;
  
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_alltoallv_native(REF_MPI ref_mpi, void *send,
                                            REF_INT *send_size, void *recv,
                                            REF_INT *recv_size, REF_INT n,
                                            REF_TYPE type) {
#ifdef HAVE_MPI
  MPI_Datatype datatype;
  MPI_Request *request;
  MPI_Status *status;
  REF_INT tag, part, offset, nreq;
  ref_malloc(request, 2 * ref_mpi_n(ref_mpi), MPI_Request);
  ref_malloc(status, 2 * ref_mpi_n(ref_mpi), MPI_Status);
  ref_type_mpi_type(type, datatype);

  if (ref_mpi_n(ref_mpi) * ref_mpi_n(ref_mpi) > ref_mpi_max_tag(ref_mpi)) {
    printf("IMPLEMENT nproc %d nproc^2 %d tag bound %d\n", ref_mpi_n(ref_mpi),
           ref_mpi_n(ref_mpi) * ref_mpi_n(ref_mpi), ref_mpi_max_tag(ref_mpi));
    return REF_IMPLEMENT;
  }

  nreq = 0;

  offset = 0;
  each_ref_mpi_part(ref_mpi, part) {
    if (0 < recv_size[part]) {
      tag = ref_mpi_n(ref_mpi) * ref_mpi_rank(ref_mpi) + part;
      RAB(0 <= tag && tag <= ref_mpi_max_tag(ref_mpi), "mpi tag outside bound",
          { printf("tag %d bound %d\n", tag, ref_mpi_max_tag(ref_mpi)); });
      switch (type) {
        case REF_INT_TYPE:
          MPI_Irecv(&(((REF_INT *)recv)[offset]), n * recv_size[part], datatype,
                    part, tag, ref_mpi_comm(ref_mpi), &(request[nreq]));
          break;
        case REF_LONG_TYPE:
          MPI_Irecv(&(((REF_LONG *)recv)[offset]), n * recv_size[part],
                    datatype, part, tag, ref_mpi_comm(ref_mpi),
                    &(request[nreq]));
          break;
        case REF_DBL_TYPE:
          MPI_Irecv(&(((REF_DBL *)recv)[offset]), n * recv_size[part], datatype,
                    part, tag, ref_mpi_comm(ref_mpi), &(request[nreq]));
          break;
        default:
          RSS(REF_IMPLEMENT, "data type");
      }
      nreq++;
    }
    offset += n * recv_size[part];
  }

  offset = 0;
  each_ref_mpi_part(ref_mpi, part) {
    if (0 < send_size[part]) {
      tag = ref_mpi_n(ref_mpi) * part + ref_mpi_rank(ref_mpi);
      RAB(0 <= tag && tag <= ref_mpi_max_tag(ref_mpi), "mpi tag outside bound",
          { printf("tag %d bound %d\n", tag, ref_mpi_max_tag(ref_mpi)); });
      switch (type) {
        case REF_INT_TYPE:
          MPI_Isend(&(((REF_INT *)send)[offset]), n * send_size[part], datatype,
                    part, tag, ref_mpi_comm(ref_mpi), &(request[nreq]));
          break;
        case REF_LONG_TYPE:
          MPI_Isend(&(((REF_LONG *)send)[offset]), n * send_size[part],
                    datatype, part, tag, ref_mpi_comm(ref_mpi),
                    &(request[nreq]));
          break;
        case REF_DBL_TYPE:
          MPI_Isend(&(((REF_DBL *)send)[offset]), n * send_size[part], datatype,
                    part, tag, ref_mpi_comm(ref_mpi), &(request[nreq]));
          break;
        default:
          RSS(REF_IMPLEMENT, "data type");
      }
      nreq++;
    }
    offset += n * send_size[part];
  }

  if (0 < nreq) MPI_Waitall(nreq, request, status);

  ref_free(status);
  ref_free(request);
  return REF_SUCCESS;
#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  SUPRESS_UNUSED_COMPILER_WARNING(send);
  SUPRESS_UNUSED_COMPILER_WARNING(send_size);
  SUPRESS_UNUSED_COMPILER_WARNING(recv);
  SUPRESS_UNUSED_COMPILER_WARNING(recv_size);
  SUPRESS_UNUSED_COMPILER_WARNING(n);
  SUPRESS_UNUSED_COMPILER_WARNING(type);
  return REF_IMPLEMENT;
#endif
}